

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VFS.hpp
# Opt level: O2

VFSNode __thiscall VFS::CVFS::CVFSDir::Copy(CVFSDir *this)

{
  _Alloc_hider _Var1;
  CVFSDir *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  CVFSDir *in_RSI;
  VFSNode VVar2;
  _func_int **local_28;
  _Alloc_hider _Stack_20;
  
  this_00 = (CVFSDir *)operator_new(0x80);
  CVFSDir(this_00,in_RSI);
  std::__shared_ptr<VFS::CVFS::CVFSDir,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<VFS::CVFS::CVFSDir,void>
            ((__shared_ptr<VFS::CVFS::CVFSDir,(__gnu_cxx::_Lock_policy)2> *)&local_28,this_00);
  _Var1._M_p = _Stack_20._M_p;
  _Stack_20._M_p = (pointer)0x0;
  (this->super_CVFSNode)._vptr_CVFSNode = local_28;
  (this->super_CVFSNode).m_Name._M_dataplus._M_p = _Var1._M_p;
  local_28 = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&_Stack_20);
  VVar2.super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  VVar2.super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &this->super_CVFSNode
  ;
  return (VFSNode)VVar2.super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

VFSNode Copy() override
                    {
                        return VFSDir(new CVFSDir(*this));
                    }